

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O0

bool __thiscall features::Surf::descriptor_computation(Surf *this,Descriptor *descr,bool upright)

{
  int iVar1;
  ImageBase *pIVar2;
  int iVar3;
  int __x;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  double dVar7;
  float local_80;
  float local_7c;
  float local_78;
  float norm;
  float local_70;
  float weight;
  float ori_dy;
  float ori_dx;
  float dy;
  float dx;
  float local_58;
  int rot_y;
  int local_50;
  int rot_x;
  int x;
  int y;
  float *descr_iter;
  float local_38;
  float cos_ori;
  float sin_ori;
  float spacing;
  int height;
  int width;
  int descr_scale;
  bool upright_local;
  Descriptor *descr_local;
  Surf *this_local;
  
  height = (int)descr->scale;
  width._3_1_ = upright;
  _descr_scale = descr;
  descr_local = (Descriptor *)this;
  pIVar2 = (ImageBase *)
           std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  spacing = (float)core::ImageBase::width(pIVar2);
  pIVar2 = (ImageBase *)
           std::__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<core::Image<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->sat);
  sin_ori = (float)core::ImageBase::height(pIVar2);
  cos_ori = (float)(height * 0xf + 1);
  if ((((_descr_scale->x < cos_ori) || (_descr_scale->y < cos_ori)) ||
      ((float)(int)spacing <= _descr_scale->x + cos_ori)) ||
     ((float)(int)sin_ori < _descr_scale->y + cos_ori)) {
    this_local._7_1_ = false;
  }
  else {
    local_38 = 0.0;
    descr_iter._4_4_ = 1.0;
    if ((width._3_1_ & 1) == 0) {
      dVar7 = std::sin((double)(ulong)(uint)_descr_scale->orientation);
      local_38 = SUB84(dVar7,0);
      dVar7 = std::cos((double)(ulong)(uint)_descr_scale->orientation);
      descr_iter._4_4_ = SUB84(dVar7,0);
    }
    descr_iter._0_4_ = 0;
    math::Vector<float,_64>::fill(&_descr_scale->data,(float *)&descr_iter);
    _x = math::Vector<float,_64>::operator[](&_descr_scale->data,0);
    for (rot_x = -10; rot_x < 10; rot_x = rot_x + 1) {
      for (local_50 = -10; local_50 < 10; local_50 = local_50 + 1) {
        local_58 = (descr_iter._4_4_ * ((float)local_50 + 0.5) + -(local_38 * ((float)rot_x + 0.5)))
                   * (float)height + _descr_scale->x;
        fVar5 = math::round<float>(&local_58);
        rot_y = (int)fVar5;
        dy = (local_38 * ((float)local_50 + 0.5) + descr_iter._4_4_ * ((float)rot_x + 0.5)) *
             (float)height + _descr_scale->y;
        fVar5 = math::round<float>(&dy);
        dx = (float)(int)fVar5;
        filter_dx_dy(this,rot_y,(int)dx,height,&ori_dx,&ori_dy);
        weight = descr_iter._4_4_ * ori_dx + local_38 * ori_dy;
        local_70 = -local_38 * ori_dx + descr_iter._4_4_ * ori_dy;
        iVar1 = local_50 * local_50;
        iVar3 = rot_x * rot_x;
        local_78 = 6.6;
        pfVar4 = &local_78;
        fVar5 = math::fastpow<float>(pfVar4,2);
        __x = (int)pfVar4;
        dVar7 = std::exp((double)(ulong)(uint)(-(float)(iVar1 + iVar3) / fVar5));
        fVar6 = SUB84(dVar7,0);
        pfVar4 = _x + 1;
        *_x = fVar6 * weight + *_x;
        _x = _x + 2;
        *pfVar4 = fVar6 * local_70 + *pfVar4;
        norm = fVar6;
        std::abs(__x);
        fVar5 = norm;
        *_x = fVar6 * extraout_XMM0_Da + *_x;
        _x = _x + 1;
        std::abs(__x);
        *_x = fVar5 * extraout_XMM0_Da_00 + *_x;
        pfVar4 = _x + 1;
        if ((local_50 + 10) % 5 != 4) {
          pfVar4 = _x + -3;
        }
        _x = pfVar4;
      }
      if ((rot_x + 10) % 5 != 4) {
        _x = _x + -0x10;
      }
    }
    local_7c = math::Vector<float,_64>::square_norm(&_descr_scale->data);
    if ((local_7c < -1e-08) || (1e-08 < local_7c)) {
      dVar7 = std::sqrt((double)(ulong)(uint)local_7c);
      local_80 = SUB84(dVar7,0);
      math::Vector<float,_64>::operator/=(&_descr_scale->data,&local_80);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
Surf::descriptor_computation (Descriptor* descr, bool upright)
{
    int const descr_scale = static_cast<int>(descr->scale);
    int const width = this->sat->width();
    int const height = this->sat->height();

    /*
     * Size of the descriptor is 20s (10s to each side). The Wavelet filter
     * have size 2s (1s to each side), plus one additional pixel for simpler
     * integral image lookup. Since the window can be rotated, 4s additional
     * pixel are needed.
     */
    float const spacing = static_cast<float>(15 * descr_scale + 1);
    if (descr->x < spacing || descr->y < spacing
        || descr->x + spacing >= width || descr->y + spacing > height)
        return false;

    float sin_ori = 0.0f, cos_ori = 1.0f;
    if (!upright)
    {
        sin_ori = std::sin(descr->orientation);
        cos_ori = std::cos(descr->orientation);
    }

    /* Interest point region has size 20 * scale. */
    descr->data.fill(0.0f);
    float* descr_iter = &descr->data[0];
    for (int y = -10; y < 10; ++y)
    {
        for (int x = -10; x < 10; ++x)
        {
            /* Rotate sample coordinate. */
            int rot_x = static_cast<int>(math::round(descr->x
                + (cos_ori * (x + 0.5f) - sin_ori * (y + 0.5f))
                * descr_scale));
            int rot_y = static_cast<int>(math::round(descr->y
                + (sin_ori * (x + 0.5f) + cos_ori * (y + 0.5f))
                * descr_scale));

            /* Obtain and rotate gradient. */
            float dx, dy;
            this->filter_dx_dy(rot_x, rot_y, descr_scale, &dx, &dy);
            float ori_dx = cos_ori * dx + sin_ori * dy;
            float ori_dy = -sin_ori * dx + cos_ori * dy;

            /* Keypoints are weighted with a Gaussian, sigma = 3.3*s. */
            float weight = std::exp(-static_cast<float>(x * x + y * y)
                / math::fastpow(2.0f * 3.3f, 2));
            *(descr_iter++) += weight * ori_dx;
            *(descr_iter++) += weight * ori_dy;
            *(descr_iter++) += weight * std::abs(ori_dx);
            *(descr_iter++) += weight * std::abs(ori_dy);

            if ((x + 10) % 5 != 4)
                descr_iter -= 4;
        }
        if ((y + 10) % 5 != 4)
            descr_iter -= 4 * 4;
    }

    /* Normalize descriptor, reject too small descriptors. */
    float norm = descr->data.square_norm();
    if (MATH_EPSILON_EQ(norm, 0.0f, 1e-8))  // TODO: Play with this.
        return false;
    descr->data /= std::sqrt(norm);

    return true;
}